

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

Position * __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Position::operator+=(Position *this,size_t t_distance)

{
  Position local_38;
  size_t local_18;
  size_t t_distance_local;
  Position *this_local;
  
  local_18 = t_distance;
  t_distance_local = (size_t)this;
  operator+(&local_38,this,t_distance);
  this->line = local_38.line;
  this->col = local_38.col;
  this->m_pos = local_38.m_pos;
  this->m_end = local_38.m_end;
  this->m_last_col = local_38.m_last_col;
  return this;
}

Assistant:

constexpr Position &operator+=(size_t t_distance) noexcept {
          *this = (*this) + t_distance;
          return *this;
        }